

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta,longdouble objective_amplifier)

{
  uint *args_1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  int *piVar1;
  bit_array *pbVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  row_iterator prVar10;
  uint r_size;
  rc_data *__last;
  long lVar11;
  rc_data *__first;
  long lVar12;
  undefined8 uVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar15;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_bc;
  uint local_b8;
  int local_b4;
  undefined8 local_b0;
  bit_array *local_a8;
  longdouble local_9c;
  solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
  *local_90;
  int *local_88;
  int *local_80;
  undefined1 local_78 [16];
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_9c = objective_amplifier;
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  lVar15 = in_ST4;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    uVar13 = 0;
  }
  else {
    local_90 = this + 0x10;
    uVar13 = 0;
    local_a8 = x;
    local_88 = last._M_current;
    do {
      local_bc = *first._M_current;
      local_80 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_78,(int)local_90);
      if (local_78._8_8_ != local_78._0_8_) {
        lVar12 = *(long *)(this + 0x50);
        prVar10 = (row_iterator)local_78._8_8_;
        do {
          piVar1 = &prVar10->value;
          prVar10 = prVar10 + 1;
          lVar11 = (long)*piVar1 * 0x10;
          *(longdouble *)(lVar12 + lVar11) = *(longdouble *)(lVar12 + lVar11) * local_68;
        } while (prVar10 != (row_iterator)local_78._0_8_);
      }
      uVar8 = solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,x);
      pbVar2 = local_a8;
      r_size = uVar8;
      if (uVar8 != 0) {
        __first = *(rc_data **)(this + 0x58);
        lVar12 = 0;
        lVar14 = in_ST0;
        lVar3 = in_ST1;
        lVar4 = in_ST2;
        lVar5 = in_ST3;
        lVar6 = in_ST4;
        in_ST4 = lVar15;
        local_b8 = uVar8;
        local_b0 = uVar13;
        do {
          in_ST3 = lVar6;
          in_ST2 = lVar5;
          in_ST1 = lVar4;
          in_ST0 = lVar3;
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x70),
                     (quadratic_cost_type<long_double> *)
                     (ulong)*(uint *)((long)&__first->id + lVar12),(int)pbVar2,x);
          __first = *(rc_data **)(this + 0x58);
          *(longdouble *)((long)&__first->value + lVar12) =
               *(longdouble *)((long)&__first->value + lVar12) + local_9c * lVar14;
          lVar12 = lVar12 + 0x20;
          lVar14 = in_ST0;
          lVar3 = in_ST1;
          lVar4 = in_ST2;
          lVar5 = in_ST3;
          lVar6 = in_ST4;
        } while ((ulong)uVar8 << 5 != lVar12);
        uVar13 = local_b0;
        lVar15 = in_ST4;
        r_size = local_b8;
        if (1 < (int)local_b8) {
          lVar12 = (long)(int)local_b8;
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__first + lVar12,(int)LZCOUNT(lVar12) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__first + lVar12);
          __last = __first + 1;
          lVar12 = lVar12 * 0x20 + -0x20;
          do {
            if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,__last,__g);
              __first = __last;
            }
            __last = __last + 1;
            lVar12 = lVar12 + -0x20;
          } while (lVar12 != 0);
          std::
          shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,__last,__g);
          uVar13 = local_b0;
          r_size = local_b8;
        }
      }
      args_1 = (uint *)(*(long *)(this + 0x60) + (long)local_bc * 4);
      uVar9 = *args_1;
      if ((int)r_size < (int)uVar9) {
        uVar9 = r_size;
      }
      local_b4 = uVar9 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_bc,(int *)args_1);
      if (0 < (int)r_size) {
        lVar12 = 0;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<long_double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (longdouble *)(*(long *)(this + 0x58) + lVar12),
                     (int *)(*(long *)(this + 0x58) + 0x10 + lVar12));
          lVar12 = lVar12 + 0x20;
        } while ((ulong)uVar8 << 5 != lVar12);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_b4);
      x = local_a8;
      bVar7 = affect<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,local_a8,(row_value *)local_78._8_8_,local_bc,local_b4,r_size,
                         local_48,local_58);
      uVar13 = CONCAT71((int7)((ulong)uVar13 >> 8),(byte)uVar13 | bVar7);
      first._M_current = local_80 + 1;
    } while (first._M_current != local_88);
  }
  return (bool)((byte)uVar13 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }